

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pad-reflect-1d.cpp
# Opt level: O0

void check_tensor(ggml_tensor *t,float *expected_t_d,int ne0,int ne1,int ne2)

{
  float fVar1;
  float fVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  float actual;
  float expected;
  int i0;
  int i1;
  int i2;
  uint local_28;
  uint local_24;
  uint local_20;
  
  if (*in_RDI != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-pad-reflect-1d.cpp"
               ,0x24,"GGML_ASSERT(%s) failed","t->type == GGML_TYPE_F32");
  }
  if (*(long *)(in_RDI + 4) != (long)in_EDX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-pad-reflect-1d.cpp"
               ,0x25,"GGML_ASSERT(%s) failed","t->ne[0] == ne0");
  }
  if (*(long *)(in_RDI + 6) != (long)in_ECX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-pad-reflect-1d.cpp"
               ,0x26,"GGML_ASSERT(%s) failed","t->ne[1] == ne1");
  }
  if (*(long *)(in_RDI + 8) != (long)in_R8D) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-pad-reflect-1d.cpp"
               ,0x27,"GGML_ASSERT(%s) failed","t->ne[2] == ne2");
  }
  for (local_20 = 0; (int)local_20 < in_R8D; local_20 = local_20 + 1) {
    for (local_24 = 0; (int)local_24 < in_ECX; local_24 = local_24 + 1) {
      for (local_28 = 0; (int)local_28 < in_EDX; local_28 = local_28 + 1) {
        fVar1 = *(float *)(in_RSI + (long)(int)(local_20 * in_ECX * in_EDX) * 4 +
                           (long)(int)(local_24 * in_EDX) * 4 + (long)(int)local_28 * 4);
        lVar3 = ggml_get_data_f32(in_RDI);
        fVar2 = *(float *)(lVar3 + (long)(int)(local_20 * in_ECX * in_EDX + local_24 * in_EDX +
                                              local_28) * 4);
        if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
          printf("expected %.1f, got %.1f at (%d,%d,%d)\n",(double)fVar1,(double)fVar2,
                 (ulong)local_28,(ulong)local_24,(ulong)local_20);
        }
        if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-pad-reflect-1d.cpp"
                     ,0x30,"GGML_ASSERT(%s) failed","expected == actual");
        }
      }
    }
  }
  return;
}

Assistant:

void check_tensor(struct ggml_tensor * t, float * expected_t_d, int ne0, int ne1, int ne2) {
    GGML_ASSERT(t->type == GGML_TYPE_F32);
    GGML_ASSERT(t->ne[0] == ne0);
    GGML_ASSERT(t->ne[1] == ne1);
    GGML_ASSERT(t->ne[2] == ne2);
    for (int i2 = 0; i2 < ne2; ++i2) {
        for (int i1 = 0; i1 < ne1; ++i1) {
            for (int i0 = 0; i0 < ne0; ++i0) {
                float expected = *(expected_t_d + i2 * ne1 * ne0 + i1 * ne0 + i0);
                float actual = ggml_get_data_f32(t)[i2 * ne1 * ne0 + i1 * ne0 + i0];
                if (expected != actual) {
                    printf("expected %.1f, got %.1f at (%d,%d,%d)\n", expected, actual, i0, i1, i2);
                }
                GGML_ASSERT(expected == actual);
            }
        }
    }
}